

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O2

bool __thiscall wabt::Opcode::IsEnabled(Opcode *this,Features *features)

{
  switch(this->enum_) {
  case Try:
  case Catch:
  case Throw:
  case Rethrow:
  case ThrowRef:
  case Delegate:
  case TryTable:
    return features->exceptions_enabled_;
  default:
    return true;
  case ReturnCall:
  case ReturnCallIndirect:
    return features->tail_call_enabled_;
  case CallRef:
    return features->function_references_enabled_;
  case I32Extend8S:
  case I32Extend16S:
  case I64Extend8S:
  case I64Extend16S:
  case I64Extend32S:
    return features->sign_extension_enabled_;
  case InterpAlloca:
  case InterpBrUnless:
  case InterpCallImport:
  case InterpData:
  case InterpDropKeep:
    return false;
  case I32TruncSatF32S:
  case I32TruncSatF32U:
  case I32TruncSatF64S:
  case I32TruncSatF64U:
  case I64TruncSatF32S:
  case I64TruncSatF32U:
  case I64TruncSatF64S:
  case I64TruncSatF64U:
    return features->sat_float_to_int_enabled_;
  case MemoryInit:
  case DataDrop:
  case MemoryCopy:
  case MemoryFill:
  case TableInit:
  case ElemDrop:
  case TableCopy:
    return features->bulk_memory_enabled_;
  case TableGet:
  case TableSet:
  case TableGrow:
  case TableSize:
  case RefNull:
  case RefIsNull:
    return features->reference_types_enabled_;
  case V128Load:
  case V128Load8Splat:
  case V128Load16Splat:
  case V128Load32Splat:
  case V128Load64Splat:
  case V128Store:
  case V128Const:
  case I8X16Shuffle:
  case I8X16Swizzle:
  case I8X16Splat:
  case I16X8Splat:
  case I32X4Splat:
  case I64X2Splat:
  case F32X4Splat:
  case F64X2Splat:
  case I8X16ExtractLaneS:
  case I8X16ExtractLaneU:
  case I8X16ReplaceLane:
  case I16X8ExtractLaneS:
  case I16X8ExtractLaneU:
  case I16X8ReplaceLane:
  case I32X4ExtractLane:
  case I32X4ReplaceLane:
  case I64X2ExtractLane:
  case I64X2ReplaceLane:
  case F32X4ExtractLane:
  case F32X4ReplaceLane:
  case F64X2ExtractLane:
  case F64X2ReplaceLane:
  case I8X16Eq:
  case I8X16Ne:
  case I8X16LtS:
  case I8X16LtU:
  case I8X16GtS:
  case I8X16GtU:
  case I8X16LeS:
  case I8X16LeU:
  case I8X16GeS:
  case I8X16GeU:
  case I16X8Eq:
  case I16X8Ne:
  case I16X8LtS:
  case I16X8LtU:
  case I16X8GtS:
  case I16X8GtU:
  case I16X8LeS:
  case I16X8LeU:
  case I16X8GeS:
  case I16X8GeU:
  case I32X4Eq:
  case I32X4Ne:
  case I32X4LtS:
  case I32X4LtU:
  case I32X4GtS:
  case I32X4GtU:
  case I32X4LeS:
  case I32X4LeU:
  case I32X4GeS:
  case I32X4GeU:
  case F32X4Eq:
  case F32X4Ne:
  case F32X4Lt:
  case F32X4Gt:
  case F32X4Le:
  case F32X4Ge:
  case F64X2Eq:
  case F64X2Ne:
  case F64X2Lt:
  case F64X2Gt:
  case F64X2Le:
  case F64X2Ge:
  case V128Not:
  case V128And:
  case V128Or:
  case V128Xor:
  case V128BitSelect:
  case V128AnyTrue:
  case V128Load8Lane:
  case V128Load16Lane:
  case V128Load32Lane:
  case V128Load64Lane:
  case V128Store8Lane:
  case V128Store16Lane:
  case V128Store32Lane:
  case V128Store64Lane:
  case I8X16Abs:
  case I8X16Neg:
  case I8X16AllTrue:
  case I8X16Bitmask:
  case I8X16Shl:
  case I8X16ShrS:
  case I8X16ShrU:
  case I8X16Add:
  case I8X16AddSatS:
  case I8X16AddSatU:
  case I8X16Sub:
  case I8X16SubSatS:
  case I8X16SubSatU:
  case I16X8Abs:
  case I16X8Neg:
  case I16X8AllTrue:
  case I16X8Bitmask:
  case I16X8Shl:
  case I16X8ShrS:
  case I16X8ShrU:
  case I16X8Add:
  case I16X8AddSatS:
  case I16X8AddSatU:
  case I16X8Sub:
  case I16X8SubSatS:
  case I16X8SubSatU:
  case I16X8Mul:
  case I32X4Abs:
  case I32X4Neg:
  case I32X4AllTrue:
  case I32X4Bitmask:
  case I32X4Shl:
  case I32X4ShrS:
  case I32X4ShrU:
  case I32X4Add:
  case I32X4Sub:
  case I32X4Mul:
  case I64X2Neg:
  case I64X2AllTrue:
  case I64X2Bitmask:
  case I64X2Shl:
  case I64X2ShrS:
  case I64X2ShrU:
  case I64X2Add:
  case I64X2Sub:
  case F32X4Abs:
  case F32X4Neg:
  case F32X4Sqrt:
  case F32X4Add:
  case F32X4Sub:
  case F32X4Mul:
  case F32X4Div:
  case F32X4Min:
  case F32X4Max:
  case F32X4PMin:
  case F32X4PMax:
  case F64X2Abs:
  case F64X2Neg:
  case F64X2Sqrt:
  case F64X2Add:
  case F64X2Sub:
  case F64X2Mul:
  case F64X2Div:
  case F64X2Min:
  case F64X2Max:
  case F64X2PMin:
  case F64X2PMax:
  case I32X4TruncSatF32X4S:
  case I32X4TruncSatF32X4U:
  case F32X4ConvertI32X4S:
  case F32X4ConvertI32X4U:
    return features->simd_enabled_;
  case I8X16RelaxedSwizzle:
  case I32X4RelaxedTruncF32X4S:
  case I32X4RelaxedTruncF32X4U:
  case I32X4RelaxedTruncF64X2SZero:
  case I32X4RelaxedTruncF64X2UZero:
  case F32X4RelaxedMadd:
  case F32X4RelaxedNmadd:
  case F64X2RelaxedMadd:
  case F64X2RelaxedNmadd:
  case I8X16RelaxedLaneSelect:
  case I16X8RelaxedLaneSelect:
  case I32X4RelaxedLaneSelect:
  case I64X2RelaxedLaneSelect:
  case F32X4RelaxedMin:
  case F32X4RelaxedMax:
  case F64X2RelaxedMin:
  case F64X2RelaxedMax:
  case I16X8RelaxedQ15mulrS:
  case I16X8DotI8X16I7X16S:
  case I32X4DotI8X16I7X16AddS:
    return features->relaxed_simd_enabled_;
  case MemoryAtomicNotify:
  case MemoryAtomicWait32:
  case MemoryAtomicWait64:
  case AtomicFence:
  case I32AtomicLoad:
  case I64AtomicLoad:
  case I32AtomicLoad8U:
  case I32AtomicLoad16U:
  case I64AtomicLoad8U:
  case I64AtomicLoad16U:
  case I64AtomicLoad32U:
  case I32AtomicStore:
  case I64AtomicStore:
  case I32AtomicStore8:
  case I32AtomicStore16:
  case I64AtomicStore8:
  case I64AtomicStore16:
  case I64AtomicStore32:
  case I32AtomicRmwAdd:
  case I64AtomicRmwAdd:
  case I32AtomicRmw8AddU:
  case I32AtomicRmw16AddU:
  case I64AtomicRmw8AddU:
  case I64AtomicRmw16AddU:
  case I64AtomicRmw32AddU:
  case I32AtomicRmwSub:
  case I64AtomicRmwSub:
  case I32AtomicRmw8SubU:
  case I32AtomicRmw16SubU:
  case I64AtomicRmw8SubU:
  case I64AtomicRmw16SubU:
  case I64AtomicRmw32SubU:
  case I32AtomicRmwAnd:
  case I64AtomicRmwAnd:
  case I32AtomicRmw8AndU:
  case I32AtomicRmw16AndU:
  case I64AtomicRmw8AndU:
  case I64AtomicRmw16AndU:
  case I64AtomicRmw32AndU:
  case I32AtomicRmwOr:
  case I64AtomicRmwOr:
  case I32AtomicRmw8OrU:
  case I32AtomicRmw16OrU:
  case I64AtomicRmw8OrU:
  case I64AtomicRmw16OrU:
  case I64AtomicRmw32OrU:
  case I32AtomicRmwXor:
  case I64AtomicRmwXor:
  case I32AtomicRmw8XorU:
  case I32AtomicRmw16XorU:
  case I64AtomicRmw8XorU:
  case I64AtomicRmw16XorU:
  case I64AtomicRmw32XorU:
  case I32AtomicRmwXchg:
  case I64AtomicRmwXchg:
  case I32AtomicRmw8XchgU:
  case I32AtomicRmw16XchgU:
  case I64AtomicRmw8XchgU:
  case I64AtomicRmw16XchgU:
  case I64AtomicRmw32XchgU:
  case I32AtomicRmwCmpxchg:
  case I64AtomicRmwCmpxchg:
  case I32AtomicRmw8CmpxchgU:
  case I32AtomicRmw16CmpxchgU:
  case I64AtomicRmw8CmpxchgU:
  case I64AtomicRmw16CmpxchgU:
  case I64AtomicRmw32CmpxchgU:
    return features->threads_enabled_;
  }
}

Assistant:

bool Opcode::IsEnabled(const Features& features) const {
  switch (enum_) {
    case Opcode::Try:
    case Opcode::Catch:
    case Opcode::Delegate:
    case Opcode::Throw:
    case Opcode::ThrowRef:
    case Opcode::TryTable:
    case Opcode::Rethrow:
      return features.exceptions_enabled();

    case Opcode::ReturnCallIndirect:
    case Opcode::ReturnCall:
      return features.tail_call_enabled();

    case Opcode::I32TruncSatF32S:
    case Opcode::I32TruncSatF32U:
    case Opcode::I32TruncSatF64S:
    case Opcode::I32TruncSatF64U:
    case Opcode::I64TruncSatF32S:
    case Opcode::I64TruncSatF32U:
    case Opcode::I64TruncSatF64S:
    case Opcode::I64TruncSatF64U:
      return features.sat_float_to_int_enabled();

    case Opcode::I32Extend8S:
    case Opcode::I32Extend16S:
    case Opcode::I64Extend8S:
    case Opcode::I64Extend16S:
    case Opcode::I64Extend32S:
      return features.sign_extension_enabled();

    case Opcode::MemoryAtomicNotify:
    case Opcode::MemoryAtomicWait32:
    case Opcode::MemoryAtomicWait64:
    case Opcode::AtomicFence:
    case Opcode::I32AtomicLoad:
    case Opcode::I64AtomicLoad:
    case Opcode::I32AtomicLoad8U:
    case Opcode::I32AtomicLoad16U:
    case Opcode::I64AtomicLoad8U:
    case Opcode::I64AtomicLoad16U:
    case Opcode::I64AtomicLoad32U:
    case Opcode::I32AtomicStore:
    case Opcode::I64AtomicStore:
    case Opcode::I32AtomicStore8:
    case Opcode::I32AtomicStore16:
    case Opcode::I64AtomicStore8:
    case Opcode::I64AtomicStore16:
    case Opcode::I64AtomicStore32:
    case Opcode::I32AtomicRmwAdd:
    case Opcode::I64AtomicRmwAdd:
    case Opcode::I32AtomicRmw8AddU:
    case Opcode::I32AtomicRmw16AddU:
    case Opcode::I64AtomicRmw8AddU:
    case Opcode::I64AtomicRmw16AddU:
    case Opcode::I64AtomicRmw32AddU:
    case Opcode::I32AtomicRmwSub:
    case Opcode::I64AtomicRmwSub:
    case Opcode::I32AtomicRmw8SubU:
    case Opcode::I32AtomicRmw16SubU:
    case Opcode::I64AtomicRmw8SubU:
    case Opcode::I64AtomicRmw16SubU:
    case Opcode::I64AtomicRmw32SubU:
    case Opcode::I32AtomicRmwAnd:
    case Opcode::I64AtomicRmwAnd:
    case Opcode::I32AtomicRmw8AndU:
    case Opcode::I32AtomicRmw16AndU:
    case Opcode::I64AtomicRmw8AndU:
    case Opcode::I64AtomicRmw16AndU:
    case Opcode::I64AtomicRmw32AndU:
    case Opcode::I32AtomicRmwOr:
    case Opcode::I64AtomicRmwOr:
    case Opcode::I32AtomicRmw8OrU:
    case Opcode::I32AtomicRmw16OrU:
    case Opcode::I64AtomicRmw8OrU:
    case Opcode::I64AtomicRmw16OrU:
    case Opcode::I64AtomicRmw32OrU:
    case Opcode::I32AtomicRmwXor:
    case Opcode::I64AtomicRmwXor:
    case Opcode::I32AtomicRmw8XorU:
    case Opcode::I32AtomicRmw16XorU:
    case Opcode::I64AtomicRmw8XorU:
    case Opcode::I64AtomicRmw16XorU:
    case Opcode::I64AtomicRmw32XorU:
    case Opcode::I32AtomicRmwXchg:
    case Opcode::I64AtomicRmwXchg:
    case Opcode::I32AtomicRmw8XchgU:
    case Opcode::I32AtomicRmw16XchgU:
    case Opcode::I64AtomicRmw8XchgU:
    case Opcode::I64AtomicRmw16XchgU:
    case Opcode::I64AtomicRmw32XchgU:
    case Opcode::I32AtomicRmwCmpxchg:
    case Opcode::I64AtomicRmwCmpxchg:
    case Opcode::I32AtomicRmw8CmpxchgU:
    case Opcode::I32AtomicRmw16CmpxchgU:
    case Opcode::I64AtomicRmw8CmpxchgU:
    case Opcode::I64AtomicRmw16CmpxchgU:
    case Opcode::I64AtomicRmw32CmpxchgU:
      return features.threads_enabled();

    case Opcode::V128Const:
    case Opcode::V128Load:
    case Opcode::V128Store:
    case Opcode::I8X16Splat:
    case Opcode::I16X8Splat:
    case Opcode::I32X4Splat:
    case Opcode::I64X2Splat:
    case Opcode::F32X4Splat:
    case Opcode::F64X2Splat:
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I32X4ExtractLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::F32X4ExtractLane:
    case Opcode::F64X2ExtractLane:
    case Opcode::I8X16ReplaceLane:
    case Opcode::I16X8ReplaceLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::F64X2ReplaceLane:
    case Opcode::I8X16Add:
    case Opcode::I16X8Add:
    case Opcode::I32X4Add:
    case Opcode::I64X2Add:
    case Opcode::I8X16Sub:
    case Opcode::I16X8Sub:
    case Opcode::I32X4Sub:
    case Opcode::I64X2Sub:
    case Opcode::I16X8Mul:
    case Opcode::I32X4Mul:
    case Opcode::I8X16Neg:
    case Opcode::I16X8Neg:
    case Opcode::I32X4Neg:
    case Opcode::I64X2Neg:
    case Opcode::I8X16AddSatS:
    case Opcode::I8X16AddSatU:
    case Opcode::I16X8AddSatS:
    case Opcode::I16X8AddSatU:
    case Opcode::I8X16SubSatS:
    case Opcode::I8X16SubSatU:
    case Opcode::I16X8SubSatS:
    case Opcode::I16X8SubSatU:
    case Opcode::I8X16Shl:
    case Opcode::I16X8Shl:
    case Opcode::I32X4Shl:
    case Opcode::I64X2Shl:
    case Opcode::I8X16ShrS:
    case Opcode::I8X16ShrU:
    case Opcode::I16X8ShrS:
    case Opcode::I16X8ShrU:
    case Opcode::I32X4ShrS:
    case Opcode::I32X4ShrU:
    case Opcode::I64X2ShrS:
    case Opcode::I64X2ShrU:
    case Opcode::V128And:
    case Opcode::V128Or:
    case Opcode::V128Xor:
    case Opcode::V128Not:
    case Opcode::V128BitSelect:
    case Opcode::V128AnyTrue:
    case Opcode::I8X16Bitmask:
    case Opcode::I16X8Bitmask:
    case Opcode::I32X4Bitmask:
    case Opcode::I64X2Bitmask:
    case Opcode::I8X16AllTrue:
    case Opcode::I16X8AllTrue:
    case Opcode::I32X4AllTrue:
    case Opcode::I64X2AllTrue:
    case Opcode::I8X16Eq:
    case Opcode::I16X8Eq:
    case Opcode::I32X4Eq:
    case Opcode::F32X4Eq:
    case Opcode::F64X2Eq:
    case Opcode::I8X16Ne:
    case Opcode::I16X8Ne:
    case Opcode::I32X4Ne:
    case Opcode::F32X4Ne:
    case Opcode::F64X2Ne:
    case Opcode::I8X16LtS:
    case Opcode::I8X16LtU:
    case Opcode::I16X8LtS:
    case Opcode::I16X8LtU:
    case Opcode::I32X4LtS:
    case Opcode::I32X4LtU:
    case Opcode::F32X4Lt:
    case Opcode::F64X2Lt:
    case Opcode::I8X16LeS:
    case Opcode::I8X16LeU:
    case Opcode::I16X8LeS:
    case Opcode::I16X8LeU:
    case Opcode::I32X4LeS:
    case Opcode::I32X4LeU:
    case Opcode::F32X4Le:
    case Opcode::F64X2Le:
    case Opcode::I8X16GtS:
    case Opcode::I8X16GtU:
    case Opcode::I16X8GtS:
    case Opcode::I16X8GtU:
    case Opcode::I32X4GtS:
    case Opcode::I32X4GtU:
    case Opcode::F32X4Gt:
    case Opcode::F64X2Gt:
    case Opcode::I8X16GeS:
    case Opcode::I8X16GeU:
    case Opcode::I16X8GeS:
    case Opcode::I16X8GeU:
    case Opcode::I32X4GeS:
    case Opcode::I32X4GeU:
    case Opcode::F32X4Ge:
    case Opcode::F64X2Ge:
    case Opcode::F32X4Neg:
    case Opcode::F64X2Neg:
    case Opcode::F32X4Abs:
    case Opcode::F64X2Abs:
    case Opcode::F32X4Min:
    case Opcode::F32X4PMin:
    case Opcode::F64X2Min:
    case Opcode::F64X2PMin:
    case Opcode::F32X4Max:
    case Opcode::F32X4PMax:
    case Opcode::F64X2Max:
    case Opcode::F64X2PMax:
    case Opcode::F32X4Add:
    case Opcode::F64X2Add:
    case Opcode::F32X4Sub:
    case Opcode::F64X2Sub:
    case Opcode::F32X4Div:
    case Opcode::F64X2Div:
    case Opcode::F32X4Mul:
    case Opcode::F64X2Mul:
    case Opcode::F32X4Sqrt:
    case Opcode::F64X2Sqrt:
    case Opcode::F32X4ConvertI32X4S:
    case Opcode::F32X4ConvertI32X4U:
    case Opcode::I32X4TruncSatF32X4S:
    case Opcode::I32X4TruncSatF32X4U:
    case Opcode::I8X16Swizzle:
    case Opcode::I8X16Shuffle:
    case Opcode::V128Load8Splat:
    case Opcode::V128Load16Splat:
    case Opcode::V128Load32Splat:
    case Opcode::V128Load64Splat:
    case Opcode::V128Load8Lane:
    case Opcode::V128Load16Lane:
    case Opcode::V128Load32Lane:
    case Opcode::V128Load64Lane:
    case Opcode::V128Store8Lane:
    case Opcode::V128Store16Lane:
    case Opcode::V128Store32Lane:
    case Opcode::V128Store64Lane:
    case Opcode::I8X16Abs:
    case Opcode::I16X8Abs:
    case Opcode::I32X4Abs:
      return features.simd_enabled();

    case Opcode::I8X16RelaxedSwizzle:
    case Opcode::I32X4RelaxedTruncF32X4S:
    case Opcode::I32X4RelaxedTruncF32X4U:
    case Opcode::I32X4RelaxedTruncF64X2SZero:
    case Opcode::I32X4RelaxedTruncF64X2UZero:
    case Opcode::F32X4RelaxedMadd:
    case Opcode::F32X4RelaxedNmadd:
    case Opcode::F64X2RelaxedMadd:
    case Opcode::F64X2RelaxedNmadd:
    case Opcode::I8X16RelaxedLaneSelect:
    case Opcode::I16X8RelaxedLaneSelect:
    case Opcode::I32X4RelaxedLaneSelect:
    case Opcode::I64X2RelaxedLaneSelect:
    case Opcode::F32X4RelaxedMin:
    case Opcode::F32X4RelaxedMax:
    case Opcode::F64X2RelaxedMin:
    case Opcode::F64X2RelaxedMax:
    case Opcode::I16X8RelaxedQ15mulrS:
    case Opcode::I16X8DotI8X16I7X16S:
    case Opcode::I32X4DotI8X16I7X16AddS:
      return features.relaxed_simd_enabled();

    case Opcode::MemoryInit:
    case Opcode::DataDrop:
    case Opcode::MemoryCopy:
    case Opcode::MemoryFill:
    case Opcode::TableInit:
    case Opcode::ElemDrop:
    case Opcode::TableCopy:
      return features.bulk_memory_enabled();

    case Opcode::TableGet:
    case Opcode::TableSet:
    case Opcode::TableGrow:
    case Opcode::TableSize:
    case Opcode::RefNull:
    case Opcode::RefIsNull:
      return features.reference_types_enabled();

    case Opcode::CallRef:
      return features.function_references_enabled();

    // Interpreter opcodes are never "enabled".
    case Opcode::InterpAlloca:
    case Opcode::InterpBrUnless:
    case Opcode::InterpCallImport:
    case Opcode::InterpData:
    case Opcode::InterpDropKeep:
      return false;

    default:
      return true;
  }
}